

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

int Au_NtkAllocObj(Au_Ntk_t *p,int nFanins,int Type)

{
  undefined8 *puVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  void *pvVar4;
  void **ppvVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *p_00;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  Au_Obj_t *pMem;
  void *pvVar12;
  ulong *puVar13;
  
  uVar10 = (((int)(nFanins + 2U) >> 2) + 1) - (uint)((nFanins + 2U & 3) == 0);
  uVar11 = ((uint)((uVar10 - 0x3f & 0x3f) != 0) * 0x40 + uVar10) - 0x3f | 0x3f;
  if ((int)uVar10 < 0x40) {
    uVar11 = uVar10;
  }
  do {
    uVar6 = (p->vPages).nSize;
    if (((ulong)uVar6 == 0) || (uVar3 = p->iHandle, 0x1000 < (int)(uVar3 + uVar11))) {
      if ((int)uVar11 < 0xfc1) {
        pvVar4 = calloc(0x1040,0x10);
        uVar6 = 0x1040;
      }
      else {
        uVar6 = uVar11 + 0x40;
        pvVar4 = calloc((ulong)uVar6,0x10);
      }
      p->nObjsAlloc = p->nObjsAlloc + uVar6;
      pVVar2 = p->vChunks;
      uVar6 = pVVar2->nSize;
      if (uVar6 == pVVar2->nCap) {
        if ((int)uVar6 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar5;
          pVVar2->nCap = 0x10;
        }
        else {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar2->pArray,(ulong)uVar6 << 4);
          }
          pVVar2->pArray = ppvVar5;
          pVVar2->nCap = uVar6 * 2;
        }
      }
      else {
        ppvVar5 = pVVar2->pArray;
      }
      iVar9 = pVVar2->nSize;
      pVVar2->nSize = iVar9 + 1;
      ppvVar5[iVar9] = pvVar4;
      pvVar12 = (void *)(((ulong)pvVar4 & 0xfffffffffffffff0) + 0x10);
      if (((ulong)pvVar4 & 0xf) == 0) {
        pvVar12 = pvVar4;
      }
      if (((ulong)pvVar12 & 0xf) != 0) {
        __assert_fail("((ABC_PTRINT_T)pMem & 0xF) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                      ,0x309,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
      }
      uVar3 = (uint)((ulong)pvVar12 >> 4) & 0x3f;
      uVar6 = 0x40 - uVar3;
      if (((ulong)pvVar12 >> 4 & 0x3f) == 0) {
        uVar6 = uVar3;
      }
      pvVar12 = (void *)((ulong)(uVar6 << 4) + (long)pvVar12);
      p->iHandle = 0;
      uVar6 = (p->vPages).nSize;
      if (uVar6 == (p->vPages).nCap) {
        if ((int)uVar6 < 0x10) {
          ppvVar5 = (p->vPages).pArray;
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(ppvVar5,0x80);
          }
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar6 * 2;
          ppvVar5 = (p->vPages).pArray;
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar6 << 4);
          }
        }
        (p->vPages).pArray = ppvVar5;
        (p->vPages).nCap = iVar9;
        uVar6 = (p->vPages).nSize;
      }
      else {
        ppvVar5 = (p->vPages).pArray;
      }
      uVar3 = uVar6 + 1;
      (p->vPages).nSize = uVar3;
      ppvVar5[(int)uVar6] = pvVar12;
      if ((int)uVar6 < 0) {
LAB_0085b6fb:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
      }
      pvVar4 = (p->vPages).pArray[(ulong)uVar3 - 1];
      uVar6 = p->iHandle;
      lVar8 = (long)(int)uVar6 * 0x10;
      puVar1 = (undefined8 *)((long)pvVar4 + lVar8);
      if (((ulong)puVar1 & 0x3f0) != 0) {
LAB_0085b71a:
        __assert_fail("(((ABC_PTRINT_T)(pMem + p->iHandle) & 0x3FF) >> 4) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                      ,0x2f4,"void Au_NtkInsertHeader(Au_Ntk_t *)");
      }
      *puVar1 = p;
      *(uint *)((long)pvVar4 + lVar8 + 8) = uVar3 * 0x1000 + (uVar6 & 0xfc0) + -0x1000;
      uVar3 = p->iHandle + 1;
      p->iHandle = uVar3;
      break;
    }
    if ((int)uVar6 < 1) goto LAB_0085b6fb;
    pvVar12 = (p->vPages).pArray[(ulong)uVar6 - 1];
    uVar7 = uVar3 & 0x3f;
    if ((uVar7 != 0) && ((int)uVar11 <= (int)(0x40 - uVar7))) break;
    if (uVar7 != 0) {
      uVar3 = (uVar3 & 0xffffffc0) + 0x40;
      p->iHandle = uVar3;
    }
    puVar1 = (undefined8 *)((long)pvVar12 + (long)(int)uVar3 * 0x10);
    if (((ulong)puVar1 & 0x3f0) != 0) goto LAB_0085b71a;
    *puVar1 = p;
    *(uint *)((long)pvVar12 + (long)(int)uVar3 * 0x10 + 8) =
         (uVar3 & 0xfc0) + uVar6 * 0x1000 + -0x1000;
    iVar9 = p->iHandle;
    uVar3 = iVar9 + 1;
    p->iHandle = uVar3;
  } while (0x1000 < (int)(iVar9 + uVar11 + 1));
  if (*(int *)((long)pvVar12 + (long)(int)uVar3 * 0x10) != 0) {
    __assert_fail("*((int *)pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,800,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
  }
  puVar13 = (ulong *)((long)pvVar12 + (long)(int)uVar3 * 0x10);
  *puVar13 = (ulong)(Type & 7) << 0x20 | (ulong)(uint)nFanins << 0x23 | (ulong)(uint)*puVar13;
  p->nObjs[Type & 7] = p->nObjs[Type & 7] + 1;
  if (Type == 2) {
    uVar6 = (p->vPis).nSize;
    if (((int)uVar6 < 0) || ((uint)puVar13[1] != 0)) {
LAB_0085b739:
      __assert_fail("f >= 0 && p->Fanins[i] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                    ,0xb3,"void Au_ObjSetFaninLit(Au_Obj_t *, int, int)");
    }
    p_00 = &p->vPis;
    *(uint *)(puVar13 + 1) = uVar6;
  }
  else {
    if (Type != 3) {
      uVar6 = (uint)((ulong)puVar13 >> 4) & 0x3f;
      goto LAB_0085b6a6;
    }
    uVar6 = (p->vPos).nSize;
    if (((int)uVar6 < 0) || (*(uint *)((long)puVar13 + 0xc) != 0)) goto LAB_0085b739;
    p_00 = &p->vPos;
    *(uint *)((long)puVar13 + 0xc) = uVar6;
  }
  uVar6 = (uint)((ulong)puVar13 >> 4) & 0x3f;
  Vec_IntPush(p_00,*(uint *)(((ulong)puVar13 & 0xfffffffffffffc00) + 8) | uVar6);
LAB_0085b6a6:
  p->iHandle = p->iHandle + uVar11;
  p->nObjsUsed = p->nObjsUsed + uVar10;
  uVar11 = *(uint *)((long)puVar13 + (8 - (ulong)((uint)puVar13 & 0x3ff)));
  Vec_IntPush(&p->vObjs,uVar6 | uVar11);
  if ((ulong *)((ulong)((uVar6 | uVar11 & 0xfff) << 4) +
               (long)(p->vPages).pArray[(int)uVar11 >> 0xc]) != puVar13) {
    __assert_fail("pTemp == pObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,0x333,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
  }
  return uVar6 | uVar11;
}

Assistant:

int Au_NtkAllocObj( Au_Ntk_t * p, int nFanins, int Type )
{
    Au_Obj_t * pMem, * pObj, * pTemp;
    int nObjInt = ((2+nFanins) >> 2) + (((2+nFanins) & 3) > 0);
    int Id, nObjIntReal = nObjInt;
    if ( nObjInt > 63 )
        nObjInt = 63 + 64 * (((nObjInt-63) >> 6) + (((nObjInt-63) & 63) > 0));
    if ( Vec_PtrSize(&p->vPages) == 0 || p->iHandle + nObjInt > (1 << 12) )
    {
        if ( nObjInt + 64 > (1 << 12) )
            pMem = ABC_CALLOC( Au_Obj_t, nObjInt + 64 ), p->nObjsAlloc += nObjInt + 64;
        else
            pMem = ABC_CALLOC( Au_Obj_t, (1 << 12) + 64 ), p->nObjsAlloc += (1 << 12) + 64;
        Vec_PtrPush( p->vChunks, pMem );
        if ( ((ABC_PTRINT_T)pMem & 0xF) )
            pMem = (Au_Obj_t *)((char *)pMem + 16 - ((ABC_PTRINT_T)pMem & 0xF));
        assert( ((ABC_PTRINT_T)pMem & 0xF) == 0 );
        p->iHandle = (((ABC_PTRINT_T)pMem & 0x3FF) >> 4);
        if ( p->iHandle )
        {
            pMem += 64 - (p->iHandle & 63);
            p->iHandle = 0; 
        }
        Vec_PtrPush( &p->vPages, pMem );
        Au_NtkInsertHeader( p );
    }
    else
    {
        pMem = (Au_Obj_t *)Vec_PtrEntryLast( &p->vPages );
        if ( (p->iHandle & 63) == 0 || nObjInt > (64 - (p->iHandle & 63)) )
        {
            if ( p->iHandle & 63 )
                p->iHandle += 64 - (p->iHandle & 63); 
            Au_NtkInsertHeader( p );
        }
        if ( p->iHandle + nObjInt > (1 << 12) )
            return Au_NtkAllocObj( p, nFanins, Type );
    }
    pObj = pMem + p->iHandle;
    assert( *((int *)pObj) == 0 );
    pObj->nFanins = nFanins;
    p->nObjs[pObj->Type = Type]++;
    if ( Type == AU_OBJ_PI )
    {
        Au_ObjSetFaninLit( pObj, 0, Vec_IntSize(&p->vPis) );
        Vec_IntPush( &p->vPis, Au_ObjId(pObj) );
    }
    else if ( Type == AU_OBJ_PO )
    {
        Au_ObjSetFaninLit( pObj, 1, Vec_IntSize(&p->vPos) );
        Vec_IntPush( &p->vPos, Au_ObjId(pObj) );
    }
    p->iHandle += nObjInt;
    p->nObjsUsed += nObjIntReal;

    Id = Au_ObjId(pObj);
    Vec_IntPush( &p->vObjs, Id );
    pTemp = Au_NtkObj( p, Id );
    assert( pTemp == pObj );
    return Id;
}